

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.cpp
# Opt level: O0

NS * __thiscall NS::clear(NS *this)

{
  bool bVar1;
  reference ppNVar2;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
  *in_RDI;
  N *n;
  iterator __end1;
  iterator __begin1;
  vector<N_*,_std::allocator<N_*>_> *__range1;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *in_stack_ffffffffffffffd0;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> local_28;
  N **local_20;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> local_18 [3];
  
  local_18[0]._M_current =
       (N **)std::vector<N_*,_std::allocator<N_*>_>::begin
                       ((vector<N_*,_std::allocator<N_*>_> *)in_RDI);
  local_20 = (N **)std::vector<N_*,_std::allocator<N_*>_>::end
                             ((vector<N_*,_std::allocator<N_*>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppNVar2 = __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::operator*
                        (local_18);
    local_28._M_current = (N **)*ppNVar2;
    in_stack_ffffffffffffffd0 = &local_28;
    std::visit<NS::clear()::__0,std::variant<std::__cxx11::string,int,double,NS*>&>
              ((anon_class_8_1_54a3980e *)in_stack_ffffffffffffffd0,in_RDI);
    __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::operator++
              (local_18);
  }
  std::vector<N_*,_std::allocator<N_*>_>::clear((vector<N_*,_std::allocator<N_*>_> *)0x196300);
  return (NS *)in_RDI;
}

Assistant:

NS* NS::clear(){
    for (auto n : _os)
        std::visit([&](auto &&data){
            if constexpr (std::is_same_v<std::decay_t<decltype(data)>, NS*>) delete data->clear();
            delete n;
        }, n->data);
    _os.clear();
    return this;
}